

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::PushNodeVersion
          (PeerManagerImpl *this,CNode *pnode,Peer *peer)

{
  CConnman *this_00;
  string msg_type;
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  Logger *pLVar2;
  Level level;
  string *this_01;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long *args_7;
  long *args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  undefined7 uStack_1d0;
  bool tx_relay;
  uint64_t your_services;
  NodeId nodeid;
  int nNodeStartingHeight;
  uint64_t nonce;
  int64_t nTime;
  uint64_t my_services;
  string local_190;
  undefined1 local_170 [40];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  CService addr_you;
  CAddress addr;
  string log_msg;
  SerParams *local_90;
  CService *local_88;
  SerParams *local_70;
  CService *local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  my_services = peer->m_our_services;
  nTime = (int64_t)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                             ();
  nonce = pnode->nLocalHostNonce;
  nNodeStartingHeight = (this->m_best_height).super___atomic_base<int>._M_i;
  nodeid = pnode->id;
  CAddress::CAddress(&addr,&pnode->addr);
  bVar1 = CNetAddr::IsRoutable((CNetAddr *)&addr);
  if (bVar1) {
    bVar1 = IsProxy((CNetAddr *)&addr);
    if (bVar1) goto LAB_001b0cdf;
    bVar1 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&addr);
    if (!bVar1) goto LAB_001b0cdf;
    CService::CService(&addr_you,&addr.super_CService);
  }
  else {
LAB_001b0cdf:
    CService::CService(&addr_you);
  }
  your_services = addr.nServices;
  bVar1 = RejectIncomingTxs(this,pnode);
  tx_relay = !bVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"version",(allocator<char> *)&local_190);
  local_70 = &CNetAddr::V1;
  local_68 = &addr_you;
  args_7 = (unsigned_long *)0x1b0d4f;
  CService::CService((CService *)local_170);
  local_90 = &CNetAddr::V1;
  this_00 = this->m_connman;
  local_50 = local_40;
  if (local_148 == local_138) {
    uStack_38 = uStack_130;
  }
  else {
    local_50 = local_148;
  }
  local_48 = local_140;
  local_140 = 0;
  local_138[0] = 0;
  msg_type._M_string_length = (size_type)&my_services;
  msg_type._M_dataplus._M_p = (pointer)&local_70;
  msg_type.field_2._M_allocated_capacity = (size_type)&local_90;
  msg_type.field_2._8_8_ = &nonce;
  local_148 = local_138;
  local_88 = (CService *)local_170;
  NetMsg::
  Make<int_const&,unsigned_long&,long_const&,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long&,std::__cxx11::string&,int_const&,bool_const&>
            ((CSerializedNetMsg *)&log_msg,(NetMsg *)&local_50,msg_type,&PROTOCOL_VERSION,
             &my_services,&nTime,&your_services,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&strSubVersion_abi_cxx11_,
             (unsigned_long *)&nNodeStartingHeight,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&tx_relay,args_7,
             in_stack_fffffffffffffe28,(int *)CONCAT17(tx_relay,uStack_1d0),(bool *)your_services);
  CConnman::PushMessage(this_00,pnode,(CSerializedNetMsg *)&log_msg);
  level = (Level)pnode;
  CSerializedNetMsg::~CSerializedNetMsg((CSerializedNetMsg *)&log_msg);
  std::__cxx11::string::~string((string *)&local_50);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_170);
  std::__cxx11::string::~string((string *)&local_148);
  if (fLogIPs == true) {
    bVar1 = ::LogAcceptCategory(NET,level);
    if (!bVar1) goto LAB_001b108b;
    CService::ToStringAddrPort_abi_cxx11_(&local_190,&addr_you);
    pLVar2 = LogInstance();
    args_4 = (long *)0x1b0eb0;
    bVar1 = BCLog::Logger::Enabled(pLVar2);
    if (bVar1) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<int,int,std::__cxx11::string,bool,long>
                ((string *)local_170,
                 (tinyformat *)
                 "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n",
                 (char *)&PROTOCOL_VERSION,&nNodeStartingHeight,(int *)&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx_relay,
                 (bool *)&nodeid,args_4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_170);
      std::__cxx11::string::~string((string *)local_170);
      pLVar2 = LogInstance();
      local_170._0_8_ = (char *)0x5b;
      local_170._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x5b;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "PushNodeVersion";
      logging_function._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x68d,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    this_01 = &local_190;
  }
  else {
    bVar1 = ::LogAcceptCategory(NET,level);
    if (!bVar1) goto LAB_001b108b;
    pLVar2 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar2);
    if (!bVar1) goto LAB_001b108b;
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<int,int,bool,long>
              ((string *)local_170,
               (tinyformat *)"send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n",
               (char *)&PROTOCOL_VERSION,&nNodeStartingHeight,(int *)&tx_relay,(bool *)&nodeid,
               (long *)in_stack_fffffffffffffe28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_170);
    std::__cxx11::string::~string((string *)local_170);
    pLVar2 = LogInstance();
    local_170._0_8_ = (char *)0x5b;
    local_170._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file_00._M_len = 0x5b;
    str_00._M_str = log_msg._M_dataplus._M_p;
    str_00._M_len = log_msg._M_string_length;
    logging_function_00._M_str = "PushNodeVersion";
    logging_function_00._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar2,str_00,logging_function_00,source_file_00,0x68f,NET,Debug);
    this_01 = &log_msg;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001b108b:
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_you);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::PushNodeVersion(CNode& pnode, const Peer& peer)
{
    uint64_t my_services{peer.m_our_services};
    const int64_t nTime{count_seconds(GetTime<std::chrono::seconds>())};
    uint64_t nonce = pnode.GetLocalNonce();
    const int nNodeStartingHeight{m_best_height};
    NodeId nodeid = pnode.GetId();
    CAddress addr = pnode.addr;

    CService addr_you = addr.IsRoutable() && !IsProxy(addr) && addr.IsAddrV1Compatible() ? addr : CService();
    uint64_t your_services{addr.nServices};

    const bool tx_relay{!RejectIncomingTxs(pnode)};
    MakeAndPushMessage(pnode, NetMsgType::VERSION, PROTOCOL_VERSION, my_services, nTime,
            your_services, CNetAddr::V1(addr_you), // Together the pre-version-31402 serialization of CAddress "addrYou" (without nTime)
            my_services, CNetAddr::V1(CService{}), // Together the pre-version-31402 serialization of CAddress "addrMe" (without nTime)
            nonce, strSubVersion, nNodeStartingHeight, tx_relay);

    if (fLogIPs) {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, them=%s, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, addr_you.ToStringAddrPort(), tx_relay, nodeid);
    } else {
        LogDebug(BCLog::NET, "send version message: version %d, blocks=%d, txrelay=%d, peer=%d\n", PROTOCOL_VERSION, nNodeStartingHeight, tx_relay, nodeid);
    }
}